

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O2

void __thiscall CGameClient::OnNewSnapshot(CGameClient *this)

{
  bool *pbVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  CNetObj_SpectatorInfo *pCVar6;
  CNetObj_GameData *pCVar7;
  CNetObj_PlayerInfo *pCVar8;
  vec2 vVar9;
  vec2 Pos;
  undefined8 uVar10;
  CCharacterInfo *pCVar11;
  char cVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined4 extraout_var;
  char *pcVar17;
  CNetObj_GameDataFlag *pCVar18;
  undefined4 extraout_var_01;
  int *piVar19;
  undefined4 extraout_var_03;
  long lVar20;
  undefined8 *puVar21;
  long lVar22;
  CSnapItem *pCVar23;
  CNetObj_GameDataFlag *pCVar24;
  int *piVar25;
  CNetObj_Character *pCVar26;
  CNetObj_Character *pCVar27;
  CTuningParams *pCVar28;
  CNetObj_Character *pCVar29;
  CNetObj_Character *pCVar30;
  CNetObj_PlayerInfo **ppCVar31;
  IClient *pIVar32;
  int iVar33;
  CClientData *pStr;
  long lVar34;
  uint uVar35;
  int i;
  ulong uVar36;
  code *pcVar37;
  CClientData *this_00;
  long in_FS_OFFSET;
  byte bVar38;
  CSnapItem Item;
  CServerInfo CurrentServerInfo;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  bVar38 = 0;
  CurrentServerInfo.m_aClients[0x21].m_aName[8] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[9] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[10] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0xb] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0xc] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0xd] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0xe] = '\0';
  CurrentServerInfo.m_aClients[0x21].m_aName[0xf] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[4] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[5] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[6] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[7] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[8] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[9] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[10] = '\0';
  CurrentServerInfo.m_aClients[2].m_aName[0xb] = '\0';
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  mem_zero(&this->m_Snap,0x3780);
  uVar13 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x1e])(this->m_pClient,0);
  if ((int)uVar13 < 1) {
    uVar13 = 0;
  }
  for (uVar35 = 0; uVar13 != uVar35; uVar35 = uVar35 + 1) {
    iVar14 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x20])
                       (this->m_pClient,0,(ulong)uVar35,&Item);
    iVar14 = CNetObjHandler::ValidateObj
                       (&this->m_NetObjHandler,Item.m_Type,(void *)CONCAT44(extraout_var,iVar14),
                        Item.m_DataSize);
    uVar10 = Item._0_8_;
    if (iVar14 != 0) {
      if (this->m_pConfig->m_Debug != 0) {
        pcVar17 = CNetObjHandler::GetObjName(&this->m_NetObjHandler,Item.m_Type);
        str_format((char *)&CurrentServerInfo,0x100,
                   "invalidated index=%d type=%d (%s) size=%d id=%d",(ulong)uVar35,
                   uVar10 & 0xffffffff,pcVar17,(ulong)stack0xffffffffffffdcc0 & 0xffffffff,
                   (ulong)Item._0_8_ >> 0x20);
        (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                  (this->m_pConsole,2,"game",&CurrentServerInfo,0);
      }
      (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x21])(this->m_pClient,0,(ulong)uVar35)
      ;
    }
  }
  ProcessEvents(this);
  pIVar32 = this->m_pClient;
  if ((this->m_pConfig->m_DbgStress != 0) && (pIVar32->m_CurGameTick % 100 == 0)) {
    iVar14 = random_int();
    for (uVar36 = 0; (ulong)(long)iVar14 % 0x3f != uVar36; uVar36 = uVar36 + 1) {
      iVar15 = random_int();
      CurrentServerInfo.m_NetAddr.ip[uVar36 - 8] = (char)(iVar15 % 0x19) + 'a';
    }
    CurrentServerInfo.m_NetAddr.ip[(ulong)(long)iVar14 % 0x3f - 8] = '\0';
    uVar13 = random_int();
    Item.m_ID = -1;
    Item.m_Type = uVar13 & 1;
    unique0x00005300 = &CurrentServerInfo;
    IClient::SendPackMsg<CNetMsg_Cl_Say>(this->m_pClient,(CNetMsg_Cl_Say *)&Item,1);
    pIVar32 = this->m_pClient;
  }
  Item.m_Type = 1000;
  Item.m_ID = 200;
  stack0xffffffffffffdcc0 = (CServerInfo *)0x52800000032;
  if (pIVar32->m_State == 4) {
    pCVar23 = &Item;
    pCVar28 = &this->m_Tuning;
    for (lVar20 = 0x10; lVar20 != 0; lVar20 = lVar20 + -1) {
      iVar14 = pCVar23->m_ID;
      pCVar28->m_GroundControlSpeed = (CTuneParam)pCVar23->m_Type;
      pCVar28->m_GroundControlAccel = (CTuneParam)iVar14;
      pCVar23 = (CSnapItem *)((long)pCVar23 + (ulong)bVar38 * -0x10 + 8);
      pCVar28 = (CTuningParams *)((long)pCVar28 + (ulong)bVar38 * -0x10 + 8);
    }
    mem_zero(&this->m_GameInfo,0x20);
    pIVar32 = this->m_pClient;
  }
  iVar14 = (*(pIVar32->super_IInterface)._vptr_IInterface[0x1e])(pIVar32,0);
  this_00 = this->m_aClients;
  ppCVar31 = (this->m_Snap).m_paPlayerInfos;
  if (iVar14 < 1) {
    iVar14 = 0;
  }
  uVar36 = 0;
  while( true ) {
    if ((int)uVar36 == iVar14) break;
    iVar15 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x20])
                       (this->m_pClient,0,uVar36,&CurrentServerInfo);
    pCVar18 = (CNetObj_GameDataFlag *)CONCAT44(extraout_var_00,iVar15);
    if (this->m_pClient->m_State == 4) {
      if (CurrentServerInfo.m_ServerIndex == 0xf) {
        mem_copy(&this->m_Tuning,pCVar18,0x80);
        this->m_ServerMode = 0;
        goto LAB_00177bab;
      }
      if (CurrentServerInfo.m_ServerIndex == 0xe) {
        iVar15 = pCVar18->m_FlagCarrierBlue;
        uVar10 = *(undefined8 *)&pCVar18->m_FlagDropTickRed;
        (this->m_GameInfo).m_GameFlags = pCVar18->m_FlagCarrierRed;
        (this->m_GameInfo).m_ScoreLimit = iVar15;
        (this->m_GameInfo).m_TimeLimit = (int)uVar10;
        (this->m_GameInfo).m_MatchNum = (int)((ulong)uVar10 >> 0x20);
        (this->m_GameInfo).m_MatchCurrent = pCVar18[1].m_FlagCarrierRed;
        goto LAB_00177bab;
      }
      if (CurrentServerInfo.m_ServerIndex != 0xd) goto LAB_00177bb2;
      lVar20 = (long)(int)CurrentServerInfo.m_NetAddr.type;
      if (lVar20 < 0x40) {
        if (pCVar18->m_FlagCarrierRed != 0) {
          this->m_LocalClientID = CurrentServerInfo.m_NetAddr.type;
        }
        pStr = this_00 + lVar20;
        pStr->m_Active = true;
        pStr->m_Team = pCVar18->m_FlagCarrierBlue;
        IntsToStr(&pCVar18->m_FlagDropTickRed,4,pStr->m_aName);
        IntsToStr(&pCVar18[1].m_FlagDropTickRed,3,pStr->m_aClan);
        pStr->m_Country = pCVar18[2].m_FlagCarrierBlue;
        piVar19 = &pCVar18[2].m_FlagDropTickRed;
        lVar22 = -0x18;
        for (lVar34 = 0x45b8; lVar34 != 0x47fe; lVar34 = lVar34 + 0x61) {
          IntsToStr(piVar19,6,(char *)((long)&this->m_All + lVar34 + lVar20 * 0x5b0 + -0x10));
          *(undefined4 *)((long)this->m_aClients[lVar20].m_aSkinPartColors + lVar22) =
               *(undefined4 *)((long)&pCVar18[0xd].m_FlagCarrierRed + lVar22);
          *(undefined4 *)((long)this->m_aClients[lVar20].m_SkinPartIDs + lVar22) =
               *(undefined4 *)((long)&pCVar18[0xe].m_FlagDropTickRed + lVar22);
          lVar22 = lVar22 + 4;
          piVar19 = piVar19 + 6;
        }
        piVar19 = &(this->m_GameInfo).m_NumPlayers;
        *piVar19 = *piVar19 + 1;
        if ((long)pStr->m_Team != -1) {
          piVar19 = (this->m_GameInfo).m_aTeamSize + pStr->m_Team;
          *piVar19 = *piVar19 + 1;
        }
        goto LAB_00177bab;
      }
    }
    else {
LAB_00177bab:
LAB_00177bb2:
      switch(CurrentServerInfo.m_ServerIndex) {
      case 5:
        (this->m_Snap).m_paFlags[(int)CurrentServerInfo.m_NetAddr.type % 2] =
             (CNetObj_Flag *)pCVar18;
        break;
      case 6:
        (this->m_Snap).m_pGameData = (CNetObj_GameData *)pCVar18;
        uVar13 = pCVar18->m_FlagCarrierBlue;
        if ((((OnNewSnapshot::s_LastGameFlags & 8U) == 0) && (lVar20 = 0xc0, (uVar13 & 8) != 0)) ||
           (((OnNewSnapshot::s_LastGameFlags & 8U) != 0 && (lVar20 = 200, (uVar13 & 8) == 0)))) {
          (**(code **)((long)(this->super_IGameClient).super_IInterface._vptr_IInterface + lVar20))
                    (this);
        }
        if (((((this->m_Snap).m_pGameData)->m_GameStartTick != this->m_LastGameStartTick) &&
            ((OnNewSnapshot::s_LastGameFlags & 0x14U) == 0)) && ((uVar13 & 0x30) != 0x10)) {
          CStats::OnMatchStart(this->m_pStats);
        }
        if ((uVar13 & 0x1c) == 0) {
          CStats::UpdatePlayTime
                    (this->m_pStats,this->m_pClient->m_CurGameTick - this->m_pClient->m_PrevGameTick
                    );
        }
        OnNewSnapshot::s_LastGameFlags = uVar13;
        this->m_LastGameStartTick = ((this->m_Snap).m_pGameData)->m_GameStartTick;
        break;
      case 7:
        (this->m_Snap).m_pGameDataTeam = (CNetObj_GameDataTeam *)pCVar18;
        break;
      case 8:
        (this->m_Snap).m_pGameDataFlag = pCVar18;
        (this->m_Snap).m_GameDataFlagSnapID = CurrentServerInfo.m_NetAddr.type;
        if (((this->m_LastFlagCarrierRed == -2) && (iVar15 = pCVar18->m_FlagCarrierRed, -1 < iVar15)
            ) || ((this->m_LastFlagCarrierBlue == -2 &&
                  (iVar15 = pCVar18->m_FlagCarrierBlue, -1 < iVar15)))) {
          CStats::OnFlagGrab(this->m_pStats,iVar15);
        }
        pCVar18 = (this->m_Snap).m_pGameDataFlag;
        iVar15 = pCVar18->m_FlagCarrierBlue;
        this->m_LastFlagCarrierRed = pCVar18->m_FlagCarrierRed;
        this->m_LastFlagCarrierBlue = iVar15;
        break;
      case 10:
        lVar20 = (long)(int)CurrentServerInfo.m_NetAddr.type;
        if (lVar20 < 0x40) {
          pbVar1 = &(this->m_Snap).m_aCharacters[lVar20].m_Active;
          iVar15 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x1f])
                             (this->m_pClient,1,10);
          piVar19 = (int *)CONCAT44(extraout_var_02,iVar15);
          pCVar30 = &(this->m_Snap).m_aCharacters[lVar20].m_Cur;
          lVar22 = 0x16;
          pCVar24 = pCVar18;
          pCVar27 = pCVar30;
          for (lVar34 = lVar22; lVar34 != 0; lVar34 = lVar34 + -1) {
            (pCVar27->super_CNetObj_CharacterCore).m_Tick = pCVar24->m_FlagCarrierRed;
            pCVar24 = (CNetObj_GameDataFlag *)((long)pCVar24 + (ulong)bVar38 * -8 + 4);
            pCVar27 = (CNetObj_Character *)((long)pCVar27 + (ulong)bVar38 * -8 + 4);
          }
          if ((this->m_Snap).m_aCharacters[lVar20].m_Cur.m_Weapon != 5) {
            iVar15 = *(int *)(pbVar1 + 0xa0);
            if (9 < iVar15) {
              iVar15 = 10;
            }
            if (iVar15 < 1) {
              iVar15 = 0;
            }
            *(int *)(pbVar1 + 0xa0) = iVar15;
          }
          if (piVar19 != (int *)0x0) {
            *pbVar1 = true;
            pCVar27 = (CNetObj_Character *)(pbVar1 + 4);
            piVar25 = piVar19;
            pCVar26 = pCVar27;
            for (lVar20 = lVar22; lVar20 != 0; lVar20 = lVar20 + -1) {
              (pCVar26->super_CNetObj_CharacterCore).m_Tick = *piVar25;
              piVar25 = piVar25 + (ulong)bVar38 * -2 + 1;
              pCVar26 = (CNetObj_Character *)((long)pCVar26 + (ulong)bVar38 * -8 + 4);
            }
            pIVar32 = this->m_pClient;
            iVar33 = pIVar32->m_GameTickSpeed * 3;
            iVar15 = (((CNetObj_Character *)(pbVar1 + 4))->super_CNetObj_CharacterCore).m_Tick +
                     iVar33;
            if (pIVar32->m_PrevGameTick <= iVar15) {
              iVar15 = pIVar32->m_PrevGameTick;
            }
            iVar33 = iVar33 + (((CNetObj_Character *)(pbVar1 + 0x5c))->super_CNetObj_CharacterCore).
                              m_Tick;
            if (pIVar32->m_CurGameTick <= iVar33) {
              iVar33 = pIVar32->m_CurGameTick;
            }
            if (this->m_aClients[(int)CurrentServerInfo.m_NetAddr.type].m_Evolved.
                super_CNetObj_CharacterCore.m_Tick == iVar15) {
              pCVar26 = &this_00[(int)CurrentServerInfo.m_NetAddr.type].m_Evolved;
              pCVar29 = pCVar27;
              for (; lVar22 != 0; lVar22 = lVar22 + -1) {
                (pCVar29->super_CNetObj_CharacterCore).m_Tick =
                     (pCVar26->super_CNetObj_CharacterCore).m_Tick;
                pCVar26 = (CNetObj_Character *)((long)pCVar26 + (ulong)bVar38 * -8 + 4);
                pCVar29 = (CNetObj_Character *)((long)pCVar29 + (ulong)bVar38 * -8 + 4);
              }
              iVar16 = mem_comp(pCVar18,piVar19,0x58);
              lVar20 = 0x16;
              if (iVar16 == 0) {
                pCVar26 = &this_00[(int)CurrentServerInfo.m_NetAddr.type].m_Evolved;
                pCVar29 = pCVar30;
                for (; lVar20 != 0; lVar20 = lVar20 + -1) {
                  (pCVar29->super_CNetObj_CharacterCore).m_Tick =
                       (pCVar26->super_CNetObj_CharacterCore).m_Tick;
                  pCVar26 = (CNetObj_Character *)((long)pCVar26 + (ulong)bVar38 * -8 + 4);
                  pCVar29 = (CNetObj_Character *)((long)pCVar29 + (ulong)bVar38 * -8 + 4);
                }
              }
            }
            if ((pCVar27->super_CNetObj_CharacterCore).m_Tick != 0) {
              EvolveCharacter(this,pCVar27,iVar15);
            }
            if ((pCVar30->super_CNetObj_CharacterCore).m_Tick != 0) {
              EvolveCharacter(this,pCVar30,iVar33);
            }
            pCVar27 = &(this->m_Snap).m_aCharacters[(int)CurrentServerInfo.m_NetAddr.type].m_Cur;
            pCVar30 = &this_00[(int)CurrentServerInfo.m_NetAddr.type].m_Evolved;
            for (lVar20 = 0x16; lVar20 != 0; lVar20 = lVar20 + -1) {
              (pCVar30->super_CNetObj_CharacterCore).m_Tick =
                   (pCVar27->super_CNetObj_CharacterCore).m_Tick;
              pCVar27 = (CNetObj_Character *)((long)pCVar27 + (ulong)bVar38 * -8 + 4);
              pCVar30 = (CNetObj_Character *)((long)pCVar30 + (ulong)bVar38 * -8 + 4);
            }
          }
          if ((CurrentServerInfo.m_NetAddr.type != this->m_LocalClientID) ||
             (this->m_pClient->m_State == 4)) {
            Pos.field_1.y = (float)(int)((ulong)*(undefined8 *)(pbVar1 + 0x60) >> 0x20);
            Pos.field_0.x = (float)(int)*(undefined8 *)(pbVar1 + 0x60);
            ProcessTriggeredEvents(this,*(int *)(pbVar1 + 0xb0),Pos);
          }
        }
        break;
      case 0xb:
        lVar20 = (long)(int)CurrentServerInfo.m_NetAddr.type;
        if ((lVar20 < 0x40) && (this->m_aClients[lVar20].m_Active == true)) {
          (this->m_Snap).m_paPlayerInfos[lVar20] = (CNetObj_PlayerInfo *)pCVar18;
          (this->m_Snap).m_aInfoByScore[lVar20].m_pPlayerInfo = (CNetObj_PlayerInfo *)pCVar18;
          (this->m_Snap).m_aInfoByScore[lVar20].m_ClientID = CurrentServerInfo.m_NetAddr.type;
          if ((this->m_LocalClientID == CurrentServerInfo.m_NetAddr.type) &&
             ((this->m_Snap).m_pLocalInfo = (CNetObj_PlayerInfo *)pCVar18,
             this_00[lVar20].m_Team == -1)) {
            (this->m_Snap).m_SpecInfo.m_Active = true;
            (this->m_Snap).m_SpecInfo.m_SpecMode = 0;
            (this->m_Snap).m_SpecInfo.m_SpectatorID = -1;
          }
          CClientData::UpdateBotRenderInfo(this_00 + lVar20,this,CurrentServerInfo.m_NetAddr.type);
        }
        break;
      case 0xc:
        (this->m_Snap).m_pSpectatorInfo = (CNetObj_SpectatorInfo *)pCVar18;
        iVar15 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x1f])
                           (this->m_pClient,1,0xc,(ulong)CurrentServerInfo.m_NetAddr.type);
        (this->m_Snap).m_pPrevSpectatorInfo =
             (CNetObj_SpectatorInfo *)CONCAT44(extraout_var_01,iVar15);
        (this->m_Snap).m_SpecInfo.m_Active = true;
        pCVar6 = (this->m_Snap).m_pSpectatorInfo;
        iVar15 = pCVar6->m_SpectatorID;
        (this->m_Snap).m_SpecInfo.m_SpecMode = pCVar6->m_SpecMode;
        (this->m_Snap).m_SpecInfo.m_SpectatorID = iVar15;
        break;
      case 0x17:
        lVar20 = (long)(int)CurrentServerInfo.m_NetAddr.type;
        if ((lVar20 < 0x40) && (this->m_aClients[lVar20].m_Active == true)) {
          (this->m_Snap).m_paPlayerInfosRace[lVar20] = (CNetObj_PlayerInfoRace *)pCVar18;
        }
        break;
      case 0x18:
        (this->m_Snap).m_pGameDataRace = (CNetObj_GameDataRace *)pCVar18;
      }
    }
    uVar36 = (ulong)((int)uVar36 + 1);
  }
  lVar20 = (long)this->m_LocalClientID;
  if (lVar20 < 0) {
    (this->m_Snap).m_SpecInfo.m_Active = true;
    if ((this->m_pClient->m_State == 4) &&
       (iVar14 = (*(this->m_pDemoPlayer->super_IInterface)._vptr_IInterface[10])(), iVar14 == 2)) {
      iVar14 = this->m_DemoSpecID;
      if (((long)iVar14 != -1) && ((this->m_Snap).m_aCharacters[iVar14].m_Active == true)) {
        (this->m_Snap).m_SpecInfo.m_SpecMode = 1;
        (this->m_Snap).m_SpecInfo.m_SpectatorID = iVar14;
        goto LAB_001780f6;
      }
    }
    if (this->m_DemoSpecMode == 1) {
      (this->m_Snap).m_SpecInfo.m_SpecMode = 0;
      (this->m_Snap).m_SpecInfo.m_SpectatorID = -1;
    }
    else {
      (this->m_Snap).m_SpecInfo.m_SpecMode = this->m_DemoSpecMode;
      (this->m_Snap).m_SpecInfo.m_SpectatorID = this->m_DemoSpecID;
    }
  }
  else if ((this->m_Snap).m_aCharacters[lVar20].m_Active == true) {
    if ((this->m_Snap).m_SpecInfo.m_Active == false) {
      (this->m_Snap).m_pLocalCharacter = &(this->m_Snap).m_aCharacters[lVar20].m_Cur;
      (this->m_Snap).m_pLocalPrevCharacter = &(this->m_Snap).m_aCharacters[lVar20].m_Prev;
      pCVar11 = (this->m_Snap).m_aCharacters + lVar20;
      uVar3 = (pCVar11->m_Cur).super_CNetObj_CharacterCore.m_X;
      uVar4 = (pCVar11->m_Cur).super_CNetObj_CharacterCore.m_Y;
      vVar9.field_1.y = (float)(int)uVar4;
      vVar9.field_0.x = (float)(int)uVar3;
      this->m_LocalCharacterPos = vVar9;
    }
  }
  else {
    iVar14 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x1f])(this->m_pClient,1,10);
    if (CONCAT44(extraout_var_03,iVar14) != 0) {
      (*(this->m_pControls->super_CComponent)._vptr_CComponent[0xe])();
    }
  }
LAB_001780f6:
  pcVar37 = CompareTime;
  if (((this->m_GameInfo).m_GameFlags & 8) == 0) {
    pcVar37 = CompareScore;
  }
  lVar20 = 0x3f0;
  for (iVar14 = 0; iVar14 != 0x3f; iVar14 = iVar14 + 1) {
    for (lVar22 = 0; lVar20 != lVar22; lVar22 = lVar22 + 0x10) {
      if ((*(long *)((long)&(this->m_Snap).m_aInfoByScore[1].m_pPlayerInfo + lVar22) != 0) &&
         ((*(long *)((long)&(this->m_Snap).m_aInfoByScore[0].m_pPlayerInfo + lVar22) == 0 ||
          (cVar12 = (*pcVar37)(), cVar12 != '\0')))) {
        puVar2 = (undefined8 *)((long)&(this->m_Snap).m_aInfoByScore[1].m_pPlayerInfo + lVar22);
        puVar21 = (undefined8 *)((long)&(this->m_Snap).m_aInfoByScore[0].m_pPlayerInfo + lVar22);
        CurrentServerInfo._0_8_ = *puVar21;
        CurrentServerInfo.m_NetAddr.ip._0_8_ =
             *(undefined8 *)((long)&(this->m_Snap).m_aInfoByScore[0].m_ClientID + lVar22);
        uVar10 = puVar2[1];
        *puVar21 = *puVar2;
        *(undefined8 *)((long)&(this->m_Snap).m_aInfoByScore[0].m_ClientID + lVar22) = uVar10;
        *puVar2 = CurrentServerInfo._0_8_;
        puVar2[1] = CurrentServerInfo.m_NetAddr.ip._0_8_;
      }
    }
    lVar20 = lVar20 + -0x10;
  }
  pCVar7 = (this->m_Snap).m_pGameData;
  for (lVar20 = 0x909; lVar20 != 0x3689; lVar20 = lVar20 + 0xb6) {
    pCVar8 = *ppCVar31;
    if (pCVar8 != (CNetObj_PlayerInfo *)0x0) {
      if ((((pCVar7 != (CNetObj_GameData *)0x0) && ((pCVar7->m_GameStateFlags & 0x31) != 0)) &&
          (pCVar7->m_GameStateEndTick == 0)) &&
         ((*(int *)((this->m_All).m_paComponents + lVar20 + -2) != -1 &&
          ((pCVar8->m_PlayerFlags & 8) == 0)))) {
        piVar19 = &(this->m_Snap).m_NotReadyCount;
        *piVar19 = *piVar19 + 1;
      }
      if (((((this->m_GameInfo).m_GameFlags & 4) != 0) &&
          (lVar22 = (long)*(int *)((this->m_All).m_paComponents + lVar20 + -2), lVar22 != -1)) &&
         ((pCVar8->m_PlayerFlags & 0x10) == 0)) {
        piVar19 = (this->m_Snap).m_AliveCount + lVar22;
        *piVar19 = *piVar19 + 1;
      }
    }
    ppCVar31 = ppCVar31 + 1;
  }
  pIVar32 = this->m_pClient;
  if (pIVar32->m_State == 4) {
    for (lVar20 = 0; lVar20 != 0x40; lVar20 = lVar20 + 1) {
      if (this_00->m_Active == true) {
        CClientData::UpdateRenderInfo(this_00,this,(int)lVar20,true);
      }
      this_00 = this_00 + 1;
    }
    pIVar32 = this->m_pClient;
  }
  iVar14 = 1;
  (*(pIVar32->super_IInterface)._vptr_IInterface[0x1d])(pIVar32,&CurrentServerInfo);
  pcVar17 = CurrentServerInfo.m_aGameType;
  iVar15 = str_comp(pcVar17,"DM");
  if ((((iVar15 == 0) || (iVar15 = str_comp(pcVar17,"TDM"), iVar15 == 0)) ||
      (iVar15 = str_comp(pcVar17,"CTF"), iVar15 == 0)) ||
     ((iVar15 = str_comp(pcVar17,"LMS"), iVar15 == 0 ||
      (iVar15 = str_comp(pcVar17,"LTS"), iVar15 == 0)))) {
    iVar14 = mem_comp(&Item,&this->m_Tuning,0x80);
    iVar14 = (uint)(iVar14 != 0) * 2;
  }
  this->m_ServerMode = iVar14;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameClient::OnNewSnapshot()
{
	// clear out the invalid pointers
	mem_zero(&m_Snap, sizeof(m_Snap));

	// secure snapshot
	{
		int Num = Client()->SnapNumItems(IClient::SNAP_CURRENT);
		for(int Index = 0; Index < Num; Index++)
		{
			IClient::CSnapItem Item;
			const void *pData = Client()->SnapGetItem(IClient::SNAP_CURRENT, Index, &Item);
			if(m_NetObjHandler.ValidateObj(Item.m_Type, pData, Item.m_DataSize) != 0)
			{
				if(Config()->m_Debug)
				{
					char aBuf[256];
					str_format(aBuf, sizeof(aBuf), "invalidated index=%d type=%d (%s) size=%d id=%d", Index, Item.m_Type, m_NetObjHandler.GetObjName(Item.m_Type), Item.m_DataSize, Item.m_ID);
					Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", aBuf);
				}
				Client()->SnapInvalidateItem(IClient::SNAP_CURRENT, Index);
			}
		}
	}

	ProcessEvents();

	if(Config()->m_DbgStress)
	{
		if((Client()->GameTick()%100) == 0)
		{
			char aMessage[64];
			int MsgLen = random_int()%(sizeof(aMessage)-1);
			for(int i = 0; i < MsgLen; i++)
				aMessage[i] = 'a'+(random_int()%('z'-'a'));
			aMessage[MsgLen] = 0;

			CNetMsg_Cl_Say Msg;
			Msg.m_Mode = random_int()&1;
			Msg.m_Target = -1;
			Msg.m_pMessage = aMessage;
			Client()->SendPackMsg(&Msg, MSGFLAG_VITAL);
		}
	}

	CTuningParams StandardTuning;
	if(Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		m_Tuning = StandardTuning;
		mem_zero(&m_GameInfo, sizeof(m_GameInfo));
	}

	// go trough all the items in the snapshot and gather the info we want
	{
		int Num = Client()->SnapNumItems(IClient::SNAP_CURRENT);
		for(int i = 0; i < Num; i++)
		{
			IClient::CSnapItem Item;
			const void *pData = Client()->SnapGetItem(IClient::SNAP_CURRENT, i, &Item);

			// demo items
			if(Client()->State() == IClient::STATE_DEMOPLAYBACK)
			{
				if(Item.m_Type == NETOBJTYPE_DE_CLIENTINFO)
				{
					const CNetObj_De_ClientInfo *pInfo = (const CNetObj_De_ClientInfo *)pData;
					int ClientID = Item.m_ID;
					if(ClientID < MAX_CLIENTS)
					{
						CClientData *pClient = &m_aClients[ClientID];

						if(pInfo->m_Local)
							m_LocalClientID = ClientID;
						pClient->m_Active = true;
						pClient->m_Team  = pInfo->m_Team;
						IntsToStr(pInfo->m_aName, 4, pClient->m_aName);
						IntsToStr(pInfo->m_aClan, 3, pClient->m_aClan);
						pClient->m_Country = pInfo->m_Country;

						for(int p = 0; p < NUM_SKINPARTS; p++)
						{
							IntsToStr(pInfo->m_aaSkinPartNames[p], 6, pClient->m_aaSkinPartNames[p]);
							pClient->m_aUseCustomColors[p] = pInfo->m_aUseCustomColors[p];
							pClient->m_aSkinPartColors[p] = pInfo->m_aSkinPartColors[p];
						}

						m_GameInfo.m_NumPlayers++;
						// calculate team-balance
						if(pClient->m_Team != TEAM_SPECTATORS)
							m_GameInfo.m_aTeamSize[pClient->m_Team]++;
					}
				}
				else if(Item.m_Type == NETOBJTYPE_DE_GAMEINFO)
				{
					const CNetObj_De_GameInfo *pInfo = (const CNetObj_De_GameInfo *)pData;

					m_GameInfo.m_GameFlags = pInfo->m_GameFlags;
					m_GameInfo.m_ScoreLimit = pInfo->m_ScoreLimit;
					m_GameInfo.m_TimeLimit = pInfo->m_TimeLimit;
					m_GameInfo.m_MatchNum = pInfo->m_MatchNum;
					m_GameInfo.m_MatchCurrent = pInfo->m_MatchCurrent;
				}
				else if(Item.m_Type == NETOBJTYPE_DE_TUNEPARAMS)
				{
					const CNetObj_De_TuneParams *pInfo = (const CNetObj_De_TuneParams *)pData;

					mem_copy(&m_Tuning, pInfo->m_aTuneParams, sizeof(m_Tuning));
					m_ServerMode = SERVERMODE_PURE;
				}
			}

			// network items
			if(Item.m_Type == NETOBJTYPE_PLAYERINFO)
			{
				const CNetObj_PlayerInfo *pInfo = (const CNetObj_PlayerInfo *)pData;
				int ClientID = Item.m_ID;
				if(ClientID < MAX_CLIENTS && m_aClients[ClientID].m_Active)
				{
					m_Snap.m_paPlayerInfos[ClientID] = pInfo;
					m_Snap.m_aInfoByScore[ClientID].m_pPlayerInfo = pInfo;
					m_Snap.m_aInfoByScore[ClientID].m_ClientID = ClientID;

					if(m_LocalClientID == ClientID)
					{
						m_Snap.m_pLocalInfo = pInfo;

						if(m_aClients[ClientID].m_Team == TEAM_SPECTATORS)
						{
							m_Snap.m_SpecInfo.m_Active = true;
							m_Snap.m_SpecInfo.m_SpecMode = SPEC_FREEVIEW;
							m_Snap.m_SpecInfo.m_SpectatorID = -1;
						}
					}
					m_aClients[ClientID].UpdateBotRenderInfo(this, ClientID);
				}
			}
			else if(Item.m_Type == NETOBJTYPE_PLAYERINFORACE)
			{
				const CNetObj_PlayerInfoRace *pInfo = (const CNetObj_PlayerInfoRace *)pData;
				int ClientID = Item.m_ID;
				if(ClientID < MAX_CLIENTS && m_aClients[ClientID].m_Active)
				{
					m_Snap.m_paPlayerInfosRace[ClientID] = pInfo;
				}
			}
			else if(Item.m_Type == NETOBJTYPE_CHARACTER)
			{
				if(Item.m_ID < MAX_CLIENTS)
				{
					CSnapState::CCharacterInfo *pCharInfo = &m_Snap.m_aCharacters[Item.m_ID];
					const void *pOld = Client()->SnapFindItem(IClient::SNAP_PREV, NETOBJTYPE_CHARACTER, Item.m_ID);
					pCharInfo->m_Cur = *((const CNetObj_Character *)pData);

					// clamp ammo count for non ninja weapon
					if(pCharInfo->m_Cur.m_Weapon != WEAPON_NINJA)
						pCharInfo->m_Cur.m_AmmoCount = clamp(pCharInfo->m_Cur.m_AmmoCount, 0, 10);

					if(pOld)
					{
						pCharInfo->m_Active = true;
						pCharInfo->m_Prev = *((const CNetObj_Character *)pOld);

						// limit evolving to 3 seconds
						int EvolvePrevTick = minimum(pCharInfo->m_Prev.m_Tick + Client()->GameTickSpeed()*3, Client()->PrevGameTick());
						int EvolveCurTick = minimum(pCharInfo->m_Cur.m_Tick + Client()->GameTickSpeed()*3, Client()->GameTick());

						// reuse the evolved char
						if(m_aClients[Item.m_ID].m_Evolved.m_Tick == EvolvePrevTick)
						{
							pCharInfo->m_Prev = m_aClients[Item.m_ID].m_Evolved;
							if(mem_comp(pData, pOld, sizeof(CNetObj_Character)) == 0)
								pCharInfo->m_Cur = m_aClients[Item.m_ID].m_Evolved;
						}

						if(pCharInfo->m_Prev.m_Tick)
							EvolveCharacter(&pCharInfo->m_Prev, EvolvePrevTick);
						if(pCharInfo->m_Cur.m_Tick)
							EvolveCharacter(&pCharInfo->m_Cur, EvolveCurTick);
						
						m_aClients[Item.m_ID].m_Evolved = m_Snap.m_aCharacters[Item.m_ID].m_Cur;
					}

					if(Item.m_ID != m_LocalClientID || Client()->State() == IClient::STATE_DEMOPLAYBACK)
						ProcessTriggeredEvents(pCharInfo->m_Cur.m_TriggeredEvents, vec2(pCharInfo->m_Cur.m_X, pCharInfo->m_Cur.m_Y));
				}
			}
			else if(Item.m_Type == NETOBJTYPE_SPECTATORINFO)
			{
				m_Snap.m_pSpectatorInfo = (const CNetObj_SpectatorInfo *)pData;
				m_Snap.m_pPrevSpectatorInfo = (const CNetObj_SpectatorInfo *)Client()->SnapFindItem(IClient::SNAP_PREV, NETOBJTYPE_SPECTATORINFO, Item.m_ID);
				m_Snap.m_SpecInfo.m_Active = true;
				m_Snap.m_SpecInfo.m_SpecMode = m_Snap.m_pSpectatorInfo->m_SpecMode;
				m_Snap.m_SpecInfo.m_SpectatorID = m_Snap.m_pSpectatorInfo->m_SpectatorID;
			}
			else if(Item.m_Type == NETOBJTYPE_GAMEDATA)
			{
				m_Snap.m_pGameData = (const CNetObj_GameData *)pData;

				static int s_LastGameFlags = 0;
				int GameFlags = m_Snap.m_pGameData->m_GameStateFlags;
				if(!(s_LastGameFlags&GAMESTATEFLAG_GAMEOVER) && GameFlags&GAMESTATEFLAG_GAMEOVER)
					OnGameOver();
				else if(s_LastGameFlags&GAMESTATEFLAG_GAMEOVER && !(GameFlags&GAMESTATEFLAG_GAMEOVER))
					OnStartGame();

				// stats
				if(m_Snap.m_pGameData->m_GameStartTick != m_LastGameStartTick && !(s_LastGameFlags&GAMESTATEFLAG_ROUNDOVER)
					&& !(s_LastGameFlags&GAMESTATEFLAG_PAUSED) && (!(GameFlags&GAMESTATEFLAG_PAUSED) || GameFlags&GAMESTATEFLAG_STARTCOUNTDOWN))
				{
					m_pStats->OnMatchStart();
				}

				if(!(GameFlags&(GAMESTATEFLAG_PAUSED|GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER)))
					m_pStats->UpdatePlayTime(Client()->GameTick() - Client()->PrevGameTick());

				s_LastGameFlags = GameFlags;
				m_LastGameStartTick = m_Snap.m_pGameData->m_GameStartTick;
			}
			else if(Item.m_Type == NETOBJTYPE_GAMEDATATEAM)
			{
				m_Snap.m_pGameDataTeam = (const CNetObj_GameDataTeam *)pData;
			}
			else if(Item.m_Type == NETOBJTYPE_GAMEDATAFLAG)
			{
				m_Snap.m_pGameDataFlag = (const CNetObj_GameDataFlag *)pData;
				m_Snap.m_GameDataFlagSnapID = Item.m_ID;

				// stats
				if(m_LastFlagCarrierRed == FLAG_ATSTAND && m_Snap.m_pGameDataFlag->m_FlagCarrierRed >= 0)
					m_pStats->OnFlagGrab(m_Snap.m_pGameDataFlag->m_FlagCarrierRed);
				else if(m_LastFlagCarrierBlue == FLAG_ATSTAND && m_Snap.m_pGameDataFlag->m_FlagCarrierBlue >= 0)
					m_pStats->OnFlagGrab(m_Snap.m_pGameDataFlag->m_FlagCarrierBlue);

				m_LastFlagCarrierRed = m_Snap.m_pGameDataFlag->m_FlagCarrierRed;
				m_LastFlagCarrierBlue = m_Snap.m_pGameDataFlag->m_FlagCarrierBlue;
			}
			else if(Item.m_Type == NETOBJTYPE_GAMEDATARACE)
			{
				m_Snap.m_pGameDataRace = (const CNetObj_GameDataRace *)pData;
			}
			else if(Item.m_Type == NETOBJTYPE_FLAG)
			{
				m_Snap.m_paFlags[Item.m_ID%2] = (const CNetObj_Flag *)pData;
			}
		}
	}

	// setup local pointers
	if(m_LocalClientID >= 0)
	{
		CSnapState::CCharacterInfo *c = &m_Snap.m_aCharacters[m_LocalClientID];
		if(c->m_Active)
		{
			if (!m_Snap.m_SpecInfo.m_Active)
			{
				m_Snap.m_pLocalCharacter = &c->m_Cur;
				m_Snap.m_pLocalPrevCharacter = &c->m_Prev;
				m_LocalCharacterPos = vec2(m_Snap.m_pLocalCharacter->m_X, m_Snap.m_pLocalCharacter->m_Y);
			}
		}
		else if(Client()->SnapFindItem(IClient::SNAP_PREV, NETOBJTYPE_CHARACTER, m_LocalClientID))
		{
			// player died
			m_pControls->OnPlayerDeath();
		}
	}
	else
	{
		m_Snap.m_SpecInfo.m_Active = true;
		if(Client()->State() == IClient::STATE_DEMOPLAYBACK && DemoPlayer()->GetDemoType() == IDemoPlayer::DEMOTYPE_SERVER &&
			m_DemoSpecID != -1 && m_Snap.m_aCharacters[m_DemoSpecID].m_Active)
		{
			m_Snap.m_SpecInfo.m_SpecMode = SPEC_PLAYER;
			m_Snap.m_SpecInfo.m_SpectatorID = m_DemoSpecID;
		}
		else
		{
			if (m_DemoSpecMode == SPEC_PLAYER)
			{
				m_Snap.m_SpecInfo.m_SpecMode = SPEC_FREEVIEW;
				m_Snap.m_SpecInfo.m_SpectatorID = -1;
			}
			else
			{
				m_Snap.m_SpecInfo.m_SpecMode = m_DemoSpecMode;
				m_Snap.m_SpecInfo.m_SpectatorID = m_DemoSpecID;
			}
		}
	}

	// sort player infos by score
	FCompareFunc Compare = (m_GameInfo.m_GameFlags&GAMEFLAG_RACE) ? CompareTime : CompareScore;

	for(int k = 0; k < MAX_CLIENTS-1; k++) // ffs, bubblesort
	{
		for(int i = 0; i < MAX_CLIENTS-k-1; i++)
		{
			if(m_Snap.m_aInfoByScore[i+1].m_pPlayerInfo && (!m_Snap.m_aInfoByScore[i].m_pPlayerInfo ||
				Compare(m_Snap.m_aInfoByScore[i].m_pPlayerInfo, m_Snap.m_aInfoByScore[i+1].m_pPlayerInfo)))
			{
				CPlayerInfoItem Tmp = m_Snap.m_aInfoByScore[i];
				m_Snap.m_aInfoByScore[i] = m_Snap.m_aInfoByScore[i+1];
				m_Snap.m_aInfoByScore[i+1] = Tmp;
			}
		}
	}

	// calc some player stats
	for(int i = 0; i < MAX_CLIENTS; ++i)
	{
		if(!m_Snap.m_paPlayerInfos[i])
			continue;

		// count not ready players
		if(m_Snap.m_pGameData && (m_Snap.m_pGameData->m_GameStateFlags&(GAMESTATEFLAG_STARTCOUNTDOWN|GAMESTATEFLAG_PAUSED|GAMESTATEFLAG_WARMUP)) &&
			m_Snap.m_pGameData->m_GameStateEndTick == 0 && m_aClients[i].m_Team != TEAM_SPECTATORS && !(m_Snap.m_paPlayerInfos[i]->m_PlayerFlags&PLAYERFLAG_READY))
			m_Snap.m_NotReadyCount++;

		// count alive players per team
		if((m_GameInfo.m_GameFlags&GAMEFLAG_SURVIVAL) && m_aClients[i].m_Team != TEAM_SPECTATORS && !(m_Snap.m_paPlayerInfos[i]->m_PlayerFlags&PLAYERFLAG_DEAD))
			m_Snap.m_AliveCount[m_aClients[i].m_Team]++;
	}

	if(Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		for(int i = 0; i < MAX_CLIENTS; ++i)
		{
			if(m_aClients[i].m_Active)
				m_aClients[i].UpdateRenderInfo(this, i, true);
		}
	}

	CServerInfo CurrentServerInfo;
	Client()->GetServerInfo(&CurrentServerInfo);
	if(str_comp(CurrentServerInfo.m_aGameType, "DM") != 0 && str_comp(CurrentServerInfo.m_aGameType, "TDM") != 0 && str_comp(CurrentServerInfo.m_aGameType, "CTF") != 0 &&
		str_comp(CurrentServerInfo.m_aGameType, "LMS") != 0 && str_comp(CurrentServerInfo.m_aGameType, "LTS") != 0)
		m_ServerMode = SERVERMODE_MOD;
	else if(mem_comp(&StandardTuning, &m_Tuning, sizeof(CTuningParams)) == 0)
		m_ServerMode = SERVERMODE_PURE;
	else
		m_ServerMode = SERVERMODE_PUREMOD;
}